

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

ptrdiff_t finderrfunc(lua_State *L)

{
  void *local_30;
  void *cf;
  cTValue *bot;
  cTValue *frame;
  lua_State *L_local;
  
  bot = L->base + -1;
  local_30 = L->cframe;
  do {
    if (bot <= (cTValue *)((L->stack).ptr64 + 8) || local_30 == (void *)0x0) {
      return 0;
    }
    while ((*(int *)(((ulong)local_30 & 0xfffffffffffffffc) + 8) < 0 &&
           (bot < (cTValue *)((L->stack).ptr64 + (long)-*(int *)((long)local_30 + 8))))) {
      if (-1 < *(int *)((long)local_30 + 0xc)) {
        return (long)*(int *)((long)local_30 + 0xc);
      }
      local_30 = *(void **)((long)local_30 + 0x20);
      if (local_30 == (void *)0x0) {
        return 0;
      }
    }
    switch((bot->u32).lo & 7) {
    case 0:
    case 4:
      bot = bot + -(ulong)((*(uint *)(bot->u64 - 4) >> 8 & 0xff) + 2);
      break;
    case 1:
      local_30 = *(void **)((long)local_30 + 0x20);
    case 3:
      bot = (cTValue *)((long)bot - (bot->u64 & 0xfffffffffffffff8));
      break;
    case 2:
      if (bot[-3].u64 == 1) {
        local_30 = *(void **)((long)local_30 + 0x20);
      }
      bot = (cTValue *)((long)bot - (bot->u64 & 0xfffffffffffffff8));
      break;
    case 5:
      if (((ulong)local_30 & 1) != 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_30 + 0xc)) {
        return (long)*(int *)((long)local_30 + 0xc);
      }
      local_30 = *(void **)((long)local_30 + 0x20);
      bot = (cTValue *)((long)bot - (bot->u64 & 0xfffffffffffffff8));
      break;
    case 6:
    case 7:
      if (*(char *)((*(ulong *)((long)bot + (-8 - (bot->u64 & 0xfffffffffffffff8))) & 0x7fffffffffff
                    ) + 10) == '\x15') {
        return (long)bot + ((8 - (bot->u64 & 0xfffffffffffffff8)) - (L->stack).ptr64);
      }
      return 0;
    default:
      return 0;
    }
  } while( true );
}

Assistant:

static ptrdiff_t finderrfunc(lua_State *L)
{
  cTValue *frame = L->base-1, *bot = tvref(L->stack)+LJ_FR2;
  void *cf = L->cframe;
  while (frame > bot && cf) {
    while (cframe_nres(cframe_raw(cf)) < 0) {  /* cframe without frame? */
      if (frame >= restorestack(L, -cframe_nres(cf)))
	break;
      if (cframe_errfunc(cf) >= 0)  /* Error handler not inherited (-1)? */
	return cframe_errfunc(cf);
      cf = cframe_prev(cf);  /* Else unwind cframe and continue searching. */
      if (cf == NULL)
	return 0;
    }
    switch (frame_typep(frame)) {
    case FRAME_LUA:
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:
      cf = cframe_prev(cf);
      /* fallthrough */
    case FRAME_VARG:
      frame = frame_prevd(frame);
      break;
    case FRAME_CONT:
      if (frame_iscont_fficb(frame))
	cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
    case FRAME_CP:
      if (cframe_canyield(cf)) return 0;
      if (cframe_errfunc(cf) >= 0)
	return cframe_errfunc(cf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:
    case FRAME_PCALLH:
      if (frame_func(frame_prevd(frame))->c.ffid == FF_xpcall)
	return savestack(L, frame_prevd(frame)+1);  /* xpcall's errorfunc. */
      return 0;
    default:
      lj_assertL(0, "bad frame type");
      return 0;
    }
  }
  return 0;
}